

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           *this,uint value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  char acStack_35 [13];
  
  uVar10 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar10 = (uVar10 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar10 = (uVar10 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                       (ulong)uVar10 * 4))) + 1;
  uVar11 = (ulong)uVar10;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar7 = uVar11 + sVar2;
  if (pbVar1->capacity_ < uVar7) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar7);
  }
  pbVar1->size_ = uVar7;
  pcVar6 = acStack_35 + uVar11;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar5 % 100) * 2);
      pcVar6 = pcVar6 + -2;
      bVar4 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar4);
  }
  pwVar3 = pbVar1->ptr_;
  if (value < 10) {
    bVar8 = (byte)value | 0x30;
    lVar9 = -1;
  }
  else {
    pcVar6[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar8 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar9 = -2;
  }
  pcVar6[lVar9] = bVar8;
  if (0 < (int)uVar10) {
    uVar7 = 0;
    do {
      pwVar3[sVar2 + uVar7] = (int)acStack_35[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }